

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O2

bool __thiscall dtc::input_buffer::consume_hex_byte(input_buffer *this,uint8_t *outByte)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = this->cursor;
  cVar2 = '\0';
  if ((-1 < (long)iVar3) && (cVar2 = '\0', iVar3 < this->size)) {
    cVar2 = this->buffer[iVar3];
  }
  bVar1 = ishexdigit(cVar2);
  if (!bVar1) {
    cVar2 = operator[](this,1);
    bVar1 = ishexdigit(cVar2);
    if (!bVar1) {
      return false;
    }
  }
  iVar3 = this->cursor;
  iVar4 = 0;
  if ((-1 < (long)iVar3) && (iVar4 = 0, iVar3 < this->size)) {
    iVar4 = (int)this->buffer[iVar3];
  }
  iVar3 = anon_unknown.dwarf_98056::digittoint(iVar4);
  cVar2 = operator[](this,1);
  iVar4 = anon_unknown.dwarf_98056::digittoint((int)cVar2);
  *outByte = (byte)iVar4 | (byte)(iVar3 << 4);
  this->cursor = this->cursor + 2;
  return true;
}

Assistant:

bool
input_buffer::consume_hex_byte(uint8_t &outByte)
{
	if (!ishexdigit((*this)[0]) && !ishexdigit((*this)[1]))
	{
		return false;
	}
	outByte = (digittoint((*this)[0]) << 4) | digittoint((*this)[1]);
	cursor += 2;
	return true;
}